

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

Bool CheckMetaData(TidyDocImpl *doc,Node *node,Bool HasMetaData)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  TidyAttrId TVar6;
  Dict *pDVar7;
  ctmbstr ptVar8;
  AttVal *pAVar9;
  Node *node_00;
  ctmbstr cp;
  char *pcVar10;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) {
    return HasMetaData;
  }
  pDVar7 = node->tag;
  if ((pDVar7 == (Dict *)0x0) || (pDVar7->id != TidyTag_META)) {
    BVar4 = yes;
    if (HasMetaData != no) goto LAB_00139d3f;
LAB_00139ca4:
    BVar4 = yes;
    if (pDVar7 == (Dict *)0x0) {
LAB_00139ccc:
      BVar4 = prvTidynodeIsText(node->content);
      if (BVar4 != no) {
        ptVar8 = textFromOneNode(doc,node->content);
        do {
          if (*ptVar8 == '\0') goto LAB_00139cfe;
          BVar4 = prvTidyIsWhite((int)*ptVar8);
          ptVar8 = ptVar8 + 1;
        } while (BVar4 != no);
        goto LAB_00139d3a;
      }
    }
    else if (pDVar7->id != TidyTag_TITLE) {
      if (((pDVar7->id == TidyTag_ADDRESS) && (node->content != (Node *)0x0)) &&
         ((pDVar7 = node->content->tag, pDVar7 != (Dict *)0x0 && (pDVar7->id == TidyTag_A))))
      goto LAB_00139d3f;
      goto LAB_00139ccc;
    }
LAB_00139cfe:
    BVar4 = no;
    if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LINK)) ||
       ((pAVar9 = prvTidyAttrGetById(node,TidyAttr_REL), pAVar9 != (AttVal *)0x0 &&
        ((pAVar9->value != (ctmbstr)0x0 &&
         (ptVar8 = prvTidytmbsubstr(pAVar9->value,"stylesheet"), ptVar8 != (ctmbstr)0x0))))))
    goto LAB_00139d3f;
  }
  else {
    pAVar9 = node->attributes;
    bVar1 = false;
    if (pAVar9 == (AttVal *)0x0) {
LAB_00139c92:
      BVar4 = yes;
      if (bVar1 || HasMetaData != no) goto LAB_00139d3f;
      pDVar7 = node->tag;
      goto LAB_00139ca4;
    }
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    do {
      if (pAVar9->dict != (Attribute *)0x0) {
        TVar6 = pAVar9->dict->id;
        if (TVar6 == TidyAttr_HTTP_EQUIV) {
          pcVar10 = pAVar9->value;
          if (pcVar10 != (char *)0x0) {
            do {
              if (*pcVar10 == '\0') goto LAB_00139bb1;
              BVar4 = prvTidyIsWhite((int)*pcVar10);
              pcVar10 = pcVar10 + 1;
            } while (BVar4 != no);
            bVar1 = true;
            if ((pAVar9->value != (ctmbstr)0x0) &&
               (iVar5 = prvTidytmbstrcasecmp(pAVar9->value,"refresh"), iVar5 == 0)) {
              prvTidyReportAccessError(doc,node,0x2e5);
              bVar3 = true;
              bVar1 = true;
            }
          }
LAB_00139bb1:
          if (pAVar9->dict == (Attribute *)0x0) goto LAB_00139c1b;
          TVar6 = pAVar9->dict->id;
        }
        if ((TVar6 == TidyAttr_CONTENT) && (pcVar10 = pAVar9->value, pcVar10 != (char *)0x0)) {
          do {
            if (*pcVar10 == '\0') goto LAB_00139c1b;
            BVar4 = prvTidyIsWhite((int)*pcVar10);
            pcVar10 = pcVar10 + 1;
          } while (BVar4 != no);
          iVar5 = prvTidytmbstrncmp(pAVar9->value,"http:",5);
          bVar1 = true;
          if (iVar5 == 0) {
            prvTidyReportAccessError(doc,node,0x2e6);
            bVar2 = true;
            bVar1 = true;
          }
        }
      }
LAB_00139c1b:
      BVar4 = prvTidyIsHTML5Mode(doc);
      if ((((BVar4 != no) && (pAVar9->dict != (Attribute *)0x0)) &&
          (pAVar9->dict->id == TidyAttr_CHARSET)) &&
         (pcVar10 = pAVar9->value, pcVar10 != (char *)0x0)) {
        do {
          if (*pcVar10 == '\0') goto LAB_00139c58;
          BVar4 = prvTidyIsWhite((int)*pcVar10);
          pcVar10 = pcVar10 + 1;
        } while (BVar4 != no);
        bVar1 = true;
      }
LAB_00139c58:
      pAVar9 = pAVar9->next;
    } while (pAVar9 != (AttVal *)0x0);
    if (!bVar2 && !bVar3) goto LAB_00139c92;
    prvTidyReportAccessError(doc,node,0x309);
  }
LAB_00139d3a:
  BVar4 = yes;
LAB_00139d3f:
  for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
    BVar4 = CheckMetaData(doc,node_00,BVar4);
  }
  return BVar4;
}

Assistant:

static Bool CheckMetaData( TidyDocImpl* doc, Node* node, Bool HasMetaData )
{
    Bool HasHttpEquiv = no;
    Bool HasContent = no;
    Bool ContainsAttr = no;

    if (Level2_Enabled( doc ))
    {
        if ( nodeIsMETA(node) )
        {
            AttVal* av;
            for (av = node->attributes; av != NULL; av = av->next)
            {
                if ( attrIsHTTP_EQUIV(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* Must not have an auto-refresh */
                    if (AttrValueIs(av, "refresh"))
                    {
                        HasHttpEquiv = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REFRESH );
                    }
                }

                if ( attrIsCONTENT(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* If the value is not an integer, then it must not be a URL */
                    if ( TY_(tmbstrncmp)(av->value, "http:", 5) == 0)
                    {
                        HasContent = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REDIRECT);
                    }
                }
                if (TY_(IsHTML5Mode)(doc) && attrIsCHARSET(av) && hasValue(av))
                {
                    ContainsAttr = yes;
                }
            }
        
            if ( HasContent || HasHttpEquiv )
            {
                HasMetaData = yes;
                TY_(ReportAccessError)( doc, node, METADATA_MISSING_REDIRECT_AUTOREFRESH);
            }
            else
            {
                if ( ContainsAttr && !HasContent && !HasHttpEquiv )
                    HasMetaData = yes;                    
            }
        }

        if ( !HasMetaData && 
             nodeIsADDRESS(node) &&
             nodeIsA(node->content) )
        {
            HasMetaData = yes;
        }
            
        if ( !HasMetaData &&
             !nodeIsTITLE(node) &&
             TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
                HasMetaData = yes;
        }

        if( !HasMetaData && nodeIsLINK(node) )
        {
            AttVal* av = attrGetREL(node);
            if( !AttrContains(av, "stylesheet") )
                HasMetaData = yes;
        }
            
        /* Check for MetaData */
        for ( node = node->content; node; node = node->next )
        {
            HasMetaData = CheckMetaData( doc, node, HasMetaData );
        }
    }
    return HasMetaData;
}